

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::DeformableConv2D_x86_avx::destroy_pipeline(DeformableConv2D_x86_avx *this)

{
  Option *in_stack_00000018;
  DeformableConv2D_x86_avx *in_stack_00000020;
  
  destroy_pipeline(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

int DeformableConv2D_x86_avx::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}